

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O2

bool hasAttribute(xmlNodePtr node,xmlChar *name)

{
  _xmlAttr *p_Var1;
  int iVar2;
  _xmlAttr **pp_Var3;
  
  pp_Var3 = &node->properties;
  do {
    p_Var1 = *pp_Var3;
    if (p_Var1 == (_xmlAttr *)0x0) break;
    iVar2 = xmlStrEqual(p_Var1->name,"time");
    pp_Var3 = &p_Var1->next;
  } while (iVar2 == 0);
  return p_Var1 != (_xmlAttr *)0x0;
}

Assistant:

static bool hasAttribute(xmlNodePtr node, const xmlChar* name) {
    xmlAttr *attr = node->properties;
    while (attr) {
        if (xmlStrEqual(attr->name, name)) {
            return true;
        }
        attr = attr->next;
    }

    return false;
}